

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
* mocker::nasm::getDefinedRegs
            (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *__return_storage_ptr__,shared_ptr<mocker::nasm::Inst> *inst)

{
  shared_ptr<mocker::nasm::Mov> *psVar1;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  bool bVar4;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_00;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_01;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_02;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_03;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_04;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_05;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_06;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_07;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_08;
  shared_ptr<mocker::nasm::Register> reg;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_108;
  shared_ptr<mocker::nasm::Mov> p;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_68;
  shared_ptr<mocker::nasm::Inst> local_58;
  shared_ptr<mocker::nasm::Inst> local_48;
  shared_ptr<mocker::nasm::Inst> local_38;
  
  std::dynamic_pointer_cast<mocker::nasm::Empty,mocker::nasm::Inst>
            ((shared_ptr<mocker::nasm::Inst> *)&p);
  if (p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::dynamic_pointer_cast<mocker::nasm::Ret,mocker::nasm::Inst>
              ((shared_ptr<mocker::nasm::Inst> *)&reg);
    if (reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::dynamic_pointer_cast<mocker::nasm::Push,mocker::nasm::Inst>
                ((shared_ptr<mocker::nasm::Inst> *)&local_108);
      if (local_108._M_ptr == (element_type *)0x0) {
        std::dynamic_pointer_cast<mocker::nasm::Jmp,mocker::nasm::Inst>(&local_58);
        bVar4 = true;
        if (local_58.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::dynamic_pointer_cast<mocker::nasm::CJump,mocker::nasm::Inst>(&local_38);
          bVar4 = true;
          if (local_38.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            std::dynamic_pointer_cast<mocker::nasm::Cmp,mocker::nasm::Inst>(&local_48);
            bVar4 = local_48.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_48.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_38.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_58.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        if (bVar4) goto LAB_0018ecaf;
        std::dynamic_pointer_cast<mocker::nasm::Mov,mocker::nasm::Inst>
                  ((shared_ptr<mocker::nasm::Inst> *)&p);
        if (p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::dynamic_pointer_cast<mocker::nasm::Lea,mocker::nasm::Inst>
                    ((shared_ptr<mocker::nasm::Inst> *)&p);
          if (p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::dynamic_pointer_cast<mocker::nasm::UnaryInst,mocker::nasm::Inst>
                      ((shared_ptr<mocker::nasm::Inst> *)&p);
            if (p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::dynamic_pointer_cast<mocker::nasm::BinaryInst,mocker::nasm::Inst>
                        ((shared_ptr<mocker::nasm::Inst> *)&p);
              if (p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::dynamic_pointer_cast<mocker::nasm::Call,mocker::nasm::Inst>
                          ((shared_ptr<mocker::nasm::Inst> *)&reg);
                if (reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0) {
                  p_Var2 = &rax()->
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                  std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                               &p,p_Var2);
                  p_Var2 = &rcx()->
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                  std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr(&local_e8,p_Var2);
                  p_Var2 = &rdx()->
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                  std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr(&local_d8,p_Var2);
                  p_Var2 = &rsp()->
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                  std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr(&local_c8,p_Var2);
                  p_Var2 = &rsi()->
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                  std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr(&local_b8,p_Var2);
                  p_Var2 = &rdi()->
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                  std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr(&local_a8,p_Var2);
                  p_Var2 = &r8()->
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                  std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr(&local_98,p_Var2);
                  p_Var2 = &r9()->
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                  std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr(&local_88,p_Var2);
                  p_Var2 = &r10()->
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                  std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr(&local_78,p_Var2);
                  p_Var2 = &r11()->
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                  std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr(&local_68,p_Var2);
                  __l_03._M_len = 10;
                  __l_03._M_array = (iterator)&p;
                  std::
                  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ::vector(__return_storage_ptr__,__l_03,(allocator_type *)&local_108);
                  lVar3 = 0x98;
                  do {
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)&p.
                                       super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + lVar3));
                    lVar3 = lVar3 + -0x10;
                  } while (lVar3 != -8);
LAB_0018f022:
                  psVar1 = (shared_ptr<mocker::nasm::Mov> *)&reg;
                  goto LAB_0018eee6;
                }
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&reg.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::dynamic_pointer_cast<mocker::nasm::Pop,mocker::nasm::Inst>
                          ((shared_ptr<mocker::nasm::Inst> *)&p);
                if (p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  std::dynamic_pointer_cast<mocker::nasm::Leave,mocker::nasm::Inst>
                            ((shared_ptr<mocker::nasm::Inst> *)&reg);
                  if (reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr != (element_type *)0x0) {
                    p_Var2 = &rsp()->
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ;
                    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *
                                 )&p,p_Var2);
                    p_Var2 = &rbp()->
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ;
                    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr(&local_e8,p_Var2);
                    __l_05._M_len = 2;
                    __l_05._M_array = (iterator)&p;
                    std::
                    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ::vector(__return_storage_ptr__,__l_05,(allocator_type *)&local_108);
                    lVar3 = 0x18;
                    do {
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                 ((long)&p.
                                         super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + lVar3));
                      lVar3 = lVar3 + -0x10;
                    } while (lVar3 != -8);
                    goto LAB_0018f022;
                  }
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&reg.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  std::dynamic_pointer_cast<mocker::nasm::Set,mocker::nasm::Inst>
                            ((shared_ptr<mocker::nasm::Inst> *)&p);
                  if (p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                      (element_type *)0x0) {
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                    std::dynamic_pointer_cast<mocker::nasm::IDiv,mocker::nasm::Inst>
                              ((shared_ptr<mocker::nasm::Inst> *)&reg);
                    if (reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr != (element_type *)0x0) {
                      p_Var2 = &rax()->
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                      ;
                      std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                    *)&p,p_Var2);
                      p_Var2 = &rdx()->
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                      ;
                      std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr(&local_e8,p_Var2);
                      __l_07._M_len = 2;
                      __l_07._M_array = (iterator)&p;
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::vector(__return_storage_ptr__,__l_07,(allocator_type *)&local_108);
                      lVar3 = 0x18;
                      do {
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                   ((long)&p.
                                           super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + lVar3));
                        lVar3 = lVar3 + -0x10;
                      } while (lVar3 != -8);
                      goto LAB_0018f022;
                    }
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&reg.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                    std::dynamic_pointer_cast<mocker::nasm::Cqo,mocker::nasm::Inst>
                              ((shared_ptr<mocker::nasm::Inst> *)&p);
                    if (p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        == (element_type *)0x0) {
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&p.
                                  super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/helper.cpp"
                                    ,0x83,
                                    "std::vector<std::shared_ptr<Register>> mocker::nasm::getDefinedRegs(const std::shared_ptr<Inst> &)"
                                   );
                    }
                    p_Var2 = &rdx()->
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ;
                    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr(&reg.
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                 ,p_Var2);
                    __l_08._M_len = 1;
                    __l_08._M_array = &reg;
                    std::
                    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ::vector(__return_storage_ptr__,__l_08,(allocator_type *)&local_108);
                  }
                  else {
                    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr(&reg.
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                 ,(__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   *)&((p.
                                        super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->dest).
                                      super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                    __l_06._M_len = 1;
                    __l_06._M_array = &reg;
                    std::
                    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ::vector(__return_storage_ptr__,__l_06,(allocator_type *)&local_108);
                  }
                }
                else {
                  std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr(&reg.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ,(__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                                &(p.
                                  super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->dest);
                  __l_04._M_len = 1;
                  __l_04._M_array = &reg;
                  std::
                  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ::vector(__return_storage_ptr__,__l_04,(allocator_type *)&local_108);
                }
              }
              else {
                std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
                          ((shared_ptr<mocker::nasm::Addr> *)&reg);
                __l_02._M_len = 1;
                __l_02._M_array = &reg;
                std::
                vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ::vector(__return_storage_ptr__,__l_02,(allocator_type *)&local_108);
              }
            }
            else {
              std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                         ,(__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                          &((p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->dest).
                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
              __l_01._M_len = 1;
              __l_01._M_array = &reg;
              std::
              vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ::vector(__return_storage_ptr__,__l_01,(allocator_type *)&local_108);
            }
          }
          else {
            std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                       &(p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->dest);
            __l_00._M_len = 1;
            __l_00._M_array = &reg;
            std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::vector(__return_storage_ptr__,__l_00,(allocator_type *)&local_108);
          }
LAB_0018eed7:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        else {
          std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)&local_108,
                     &((p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->dest).super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>);
          std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
                    ((shared_ptr<mocker::nasm::Addr> *)&reg);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
          if (reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_108,
                       &reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>);
            __l._M_len = 1;
            __l._M_array = (iterator)&local_108;
            std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::vector(__return_storage_ptr__,__l,(allocator_type *)&local_58);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount)
            ;
            goto LAB_0018eed7;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          (__return_storage_ptr__->
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        }
        psVar1 = &p;
LAB_0018eee6:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&(psVar1->super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
        return __return_storage_ptr__;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_0018ecaf:
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<Register>>
getDefinedRegs(const std::shared_ptr<Inst> &inst) {
  if (dyc<Empty>(inst) || dyc<Ret>(inst) || dyc<Push>(inst) || dyc<Jmp>(inst) ||
      dyc<CJump>(inst) || dyc<Cmp>(inst)) {
    return {};
  }
  if (auto p = dyc<Mov>(inst)) {
    if (auto reg = dyc<nasm::Register>(p->getDest()))
      return {reg};
    return {};
  }
  if (auto p = dyc<Lea>(inst)) {
    return {p->getDest()};
  }
  if (auto p = dyc<UnaryInst>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<BinaryInst>(inst)) {
    return {dyc<Register>(p->getLhs())};
  }
  if (auto p = dyc<Call>(inst)) {
    return {rax(), rcx(), rdx(), rsp(), rsi(), rdi(), r8(), r9(), r10(), r11()};
  }
  if (auto p = dyc<Pop>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<Leave>(inst)) {
    return {rsp(), rbp()};
  }
  if (auto p = dyc<Set>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<IDiv>(inst)) {
    return {rax(), rdx()};
  }
  if (auto p = dyc<Cqo>(inst)) {
    return {rdx()};
  }
  assert(false);
}